

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  int *piVar1;
  char *pcVar2;
  ImGuiOldColumns *pIVar3;
  void *pvVar4;
  ImGuiStoragePair *pIVar5;
  float *pfVar6;
  ImGuiWindow **ppIVar7;
  uint *puVar8;
  long lVar9;
  ulong uVar10;
  
  pcVar2 = this->Name;
  if (pcVar2 != (char *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
  }
  if ((this->ColumnsStorage).Size != 0) {
    lVar9 = 0x68;
    uVar10 = 0;
    do {
      pIVar3 = (this->ColumnsStorage).Data;
      ImDrawListSplitter::ClearFreeMemory((ImDrawListSplitter *)(&pIVar3->IsFirstFrame + lVar9));
      pvVar4 = *(void **)((long)&pIVar3->OffMaxX + lVar9);
      if (pvVar4 != (void *)0x0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar4,GImAllocatorUserData);
      }
      pvVar4 = *(void **)((long)&pIVar3->ID + lVar9);
      if (pvVar4 != (void *)0x0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar4,GImAllocatorUserData);
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x88;
    } while (uVar10 != (uint)(this->ColumnsStorage).Size);
  }
  ImDrawList::~ImDrawList(&this->DrawListInst);
  pIVar3 = (this->ColumnsStorage).Data;
  if (pIVar3 != (ImGuiOldColumns *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
  }
  pIVar5 = (this->StateStorage).Data.Data;
  if (pIVar5 != (ImGuiStoragePair *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
  }
  pfVar6 = (this->DC).TextWrapPosStack.Data;
  if (pfVar6 != (float *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pfVar6,GImAllocatorUserData);
  }
  pfVar6 = (this->DC).ItemWidthStack.Data;
  if (pfVar6 != (float *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pfVar6,GImAllocatorUserData);
  }
  ppIVar7 = (this->DC).ChildWindows.Data;
  if (ppIVar7 != (ImGuiWindow **)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(ppIVar7,GImAllocatorUserData);
  }
  puVar8 = (this->IDStack).Data;
  if (puVar8 != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(puVar8,GImAllocatorUserData);
  }
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiOldColumns();
}